

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O1

RPCHelpMan * wallet::bumpfee(void)

{
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"bumpfee","");
  bumpfee_helper(in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan bumpfee() { return bumpfee_helper("bumpfee"); }